

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

HelicsFederate generateNewHelicsFederateObject(shared_ptr<helics::Federate> *fed,FederateType type)

{
  pointer pFVar1;
  element_type *this;
  FederateType in_ESI;
  unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *in_RDI;
  void *hfed;
  __single_object fedI;
  shared_ptr<helics::Federate> *in_stack_ffffffffffffff88;
  shared_ptr<helics::Federate> *in_stack_ffffffffffffff90;
  unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *in_stack_ffffffffffffffc8;
  MasterObjectHolder *in_stack_ffffffffffffffd0;
  
  std::make_unique<helics::FedObject>();
  std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>::operator->
            ((unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *)0x1b8feb);
  std::shared_ptr<helics::Federate>::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  pFVar1 = std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>::operator->
                     ((unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *)
                      0x1b900e);
  pFVar1->type = in_ESI;
  pFVar1 = std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>::operator->
                     ((unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *)
                      0x1b901e);
  pFVar1->valid = 0x2352188;
  pFVar1 = std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>::get
                     ((unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *)
                      in_stack_ffffffffffffff90);
  getMasterHolder();
  this = std::__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x1b904a);
  std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>::unique_ptr
            ((unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *)this,
             (unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *)
             in_stack_ffffffffffffff88);
  MasterObjectHolder::addFed(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>::~unique_ptr(in_RDI);
  std::shared_ptr<MasterObjectHolder>::~shared_ptr((shared_ptr<MasterObjectHolder> *)0x1b9088);
  std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>::~unique_ptr(in_RDI);
  return pFVar1;
}

Assistant:

HelicsFederate generateNewHelicsFederateObject(std::shared_ptr<helics::Federate> fed, helics::FederateType type)
{
    auto fedI = std::make_unique<helics::FedObject>();
    fedI->fedptr = std::move(fed);
    fedI->type = type;
    fedI->valid = fedValidationIdentifier;
    auto* hfed = reinterpret_cast<HelicsFederate>(fedI.get());
    getMasterHolder()->addFed(std::move(fedI));
    return (hfed);
}